

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_writer.cpp
# Opt level: O2

void __thiscall dpfb::FontWriter::FontWriter(FontWriter *this,char *name,char *fileExtension)

{
  char *__s2;
  int iVar1;
  FontWriter *pFVar2;
  FontWriter **ppFVar3;
  
  this->_vptr_FontWriter = (_func_int **)&PTR__FontWriter_00128a30;
  this->name = name;
  this->fileExtension = fileExtension;
  pFVar2 = findPlugin<dpfb::FontWriter>(name);
  if (pFVar2 != (FontWriter *)0x0) {
    fprintf(_stderr,"FontWriter \"%s\" is already registered\n",this->name);
    exit(1);
  }
  __s2 = this->name;
  ppFVar3 = (FontWriter **)&list;
  while (pFVar2 = *ppFVar3, pFVar2 != (FontWriter *)0x0) {
    iVar1 = strcmp(pFVar2->name,__s2);
    if (-1 < iVar1) break;
    ppFVar3 = &pFVar2->next;
  }
  this->next = pFVar2;
  *ppFVar3 = this;
  return;
}

Assistant:

FontWriter::FontWriter(const char* name, const char* fileExtension)
    : name {name}
    , fileExtension {fileExtension}
{
    LINK_PLUGIN(FontWriter);
}